

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
ADPlanner::GetSearchPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ADPlanner *this,
          ADSearchStateSpace_t *pSearchStateSpace,int *solcost)

{
  uint uVar1;
  void *pvVar2;
  DiscreteSpaceInformation *pDVar3;
  pointer piVar4;
  int iVar5;
  uint uVar6;
  reference pvVar7;
  SBPL_Exception *pSVar8;
  int i;
  CMDPSTATE *__x;
  size_type __n;
  value_type vVar9;
  CMDPSTATE *local_70;
  vector<int,_std::allocator<int>_> SuccIDV;
  vector<int,_std::allocator<int>_> CostV;
  
  SuccIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CostV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  SuccIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  SuccIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CostV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  CostV.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->bforwardsearch == true) {
    local_70 = pSearchStateSpace->searchgoalstate;
    __x = pSearchStateSpace->searchstartstate;
    iVar5 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x30])(this,pSearchStateSpace);
    if (iVar5 == 1) goto LAB_0013b374;
  }
  else {
    __x = pSearchStateSpace->searchgoalstate;
    local_70 = pSearchStateSpace->searchstartstate;
LAB_0013b374:
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&__x->StateID);
    *solcost = 0;
    if (_stdout == 0) {
      pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: could not open file");
      __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar6 = 0;
    while( true ) {
      uVar1 = __x->StateID;
      if ((((uVar1 == local_70->StateID) || (99999 < uVar6)) ||
          (pvVar2 = __x->PlannerSpecificData, pvVar2 == (void *)0x0)) ||
         ((*(long *)((long)pvVar2 + 0x38) == 0 || (*(int *)((long)pvVar2 + 0x24) == 1000000000))))
      break;
      pDVar3 = (this->super_SBPLPlanner).environment_;
      (*pDVar3->_vptr_DiscreteSpaceInformation[5])(pDVar3,(ulong)uVar1,&SuccIDV,&CostV);
      uVar6 = uVar6 + 1;
      vVar9 = 1000000000;
      for (__n = 0; (long)__n <
                    (long)(int)((ulong)((long)SuccIDV.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)SuccIDV.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 2);
          __n = __n + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::at(&SuccIDV,__n);
        if ((*pvVar7 == **(int **)((long)pvVar2 + 0x38)) &&
           (pvVar7 = std::vector<int,_std::allocator<int>_>::at(&CostV,__n), *pvVar7 < vVar9)) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::at(&CostV,__n);
          vVar9 = *pvVar7;
        }
      }
      *solcost = *solcost + vVar9;
      if (*(uint *)((long)pvVar2 + 0x20) < *(uint *)((long)pvVar2 + 0x24)) {
        (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x31])(this,pvVar2,_stdout);
        pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(pSVar8,"ERROR: underconsistent state on the path");
        __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      __x = *(CMDPSTATE **)((long)pvVar2 + 0x38);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&__x->StateID);
    }
    if (uVar1 == local_70->StateID) goto LAB_0013b4b0;
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish != piVar4) {
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = piVar4;
    }
  }
  *solcost = 1000000000;
LAB_0013b4b0:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&CostV.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&SuccIDV.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<int> ADPlanner::GetSearchPath(ADSearchStateSpace_t* pSearchStateSpace, int& solcost)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    vector<int> wholePathIds;
    ADState* searchstateinfo;
    CMDPSTATE* state = NULL;
    CMDPSTATE* goalstate = NULL;
    CMDPSTATE* startstate = NULL;

    if (bforwardsearch) {
        startstate = pSearchStateSpace->searchstartstate;
        goalstate = pSearchStateSpace->searchgoalstate;

        //reconstruct the path by setting bestnextstate pointers appropriately
        if (ReconstructPath(pSearchStateSpace) != 1) {
            solcost = INFINITECOST;
            return wholePathIds;
        }
    }
    else {
        startstate = pSearchStateSpace->searchgoalstate;
        goalstate = pSearchStateSpace->searchstartstate;
    }

#if DEBUG
    //PrintSearchPath(pSearchStateSpace, fDeb);
#endif

    state = startstate;

    wholePathIds.push_back(state->StateID);
    solcost = 0;

    FILE* fOut = stdout;
    if (fOut == NULL) {
        throw SBPL_Exception("ERROR: could not open file");
    }
    int steps = 0;
    const int max_steps = 100000;
    while (state->StateID != goalstate->StateID && steps < max_steps) {
        steps++;

        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ADState*)state->PlannerSpecificData;

        if (searchstateinfo->bestnextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }

        environment_->GetSuccs(state->StateID, &SuccIDV, &CostV);
        int actioncost = INFINITECOST;
        for (int i = 0; i < (int)SuccIDV.size(); i++) {
            if (SuccIDV.at(i) == searchstateinfo->bestnextstate->StateID && CostV.at(i) < actioncost) actioncost
                = CostV.at(i);

        }
        solcost += actioncost;

        if (searchstateinfo->v < searchstateinfo->g) {
            const char* msg = "ERROR: underconsistent state on the path";
            SBPL_ERROR("%s\n", msg);
            PrintSearchState(searchstateinfo, stdout);
            //SBPL_FPRINTF(fDeb, "ERROR: underconsistent state on the path\n");
            //PrintSearchState(searchstateinfo, fDeb);
            throw SBPL_Exception(msg);
        }

        //SBPL_FPRINTF(fDeb, "actioncost=%d between states %d and %d\n",
        //        actioncost, state->StateID, searchstateinfo->bestnextstate->StateID);
        //environment_->PrintState(state->StateID, false, fDeb);
        //environment_->PrintState(searchstateinfo->bestnextstate->StateID, false, fDeb);

        state = searchstateinfo->bestnextstate;

        wholePathIds.push_back(state->StateID);
    }

    if (state->StateID != goalstate->StateID) {
        SBPL_ERROR("ERROR: Failed to getsearchpath, steps processed=%d\n", steps);
        wholePathIds.clear();
        solcost = INFINITECOST;
        return wholePathIds;
    }

    //PrintSearchPath(pSearchStateSpace, stdout);

    return wholePathIds;
}